

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

uchar * __thiscall kj::Vector<unsigned_char>::add<int>(Vector<unsigned_char> *this,int *params)

{
  uchar *puVar1;
  RemoveConst<unsigned_char> *pRVar2;
  
  pRVar2 = (this->builder).pos;
  if (pRVar2 == (this->builder).endPtr) {
    grow(this,0);
    pRVar2 = (this->builder).pos;
  }
  *pRVar2 = (RemoveConst<unsigned_char>)*params;
  puVar1 = (this->builder).pos;
  (this->builder).pos = puVar1 + 1;
  return puVar1;
}

Assistant:

inline T& add(Params&&... params) KJ_LIFETIMEBOUND {
    if (builder.isFull()) grow();
    return builder.add(kj::fwd<Params>(params)...);
  }